

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void scalar_test(void)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  secp256k1_scalar r1_9;
  secp256k1_scalar r1_8;
  secp256k1_scalar r1_7;
  secp256k1_scalar r2_6;
  secp256k1_scalar r1_6;
  secp256k1_scalar t_2;
  secp256k1_scalar r2_5;
  secp256k1_scalar r1_5;
  secp256k1_scalar r2_4;
  secp256k1_scalar r1_4;
  secp256k1_scalar r2_3;
  secp256k1_scalar r1_3;
  secp256k1_scalar r2_2;
  secp256k1_scalar r1_2;
  int bit;
  int i_3;
  secp256k1_scalar b;
  secp256k1_scalar r2_1;
  secp256k1_scalar r1_1;
  secp256k1_scalar r2;
  secp256k1_scalar r1;
  int expected;
  int shift;
  int low;
  int i_2;
  secp256k1_scalar r;
  int now;
  int j_1;
  secp256k1_scalar t_1;
  int i_1;
  secp256k1_scalar n_1;
  int j;
  secp256k1_scalar t;
  secp256k1_scalar n;
  int i;
  uchar c [32];
  secp256k1_scalar s2;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  uint in_stack_fffffffffffffc38;
  uint in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  uint32_t in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffc4c;
  secp256k1_scalar *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc58;
  uint in_stack_fffffffffffffc5c;
  secp256k1_scalar *in_stack_fffffffffffffc60;
  secp256k1_scalar *in_stack_fffffffffffffc68;
  secp256k1_scalar *in_stack_fffffffffffffc70;
  secp256k1_scalar *in_stack_fffffffffffffc78;
  secp256k1_scalar *in_stack_fffffffffffffc80;
  secp256k1_scalar local_360;
  secp256k1_scalar local_340 [2];
  secp256k1_scalar local_300;
  secp256k1_scalar local_2e0;
  secp256k1_scalar local_2c0;
  secp256k1_scalar local_2a0;
  secp256k1_scalar local_280;
  secp256k1_scalar local_260;
  secp256k1_scalar local_240;
  secp256k1_scalar local_220;
  int local_200;
  int local_1fc;
  secp256k1_scalar local_1f8;
  secp256k1_scalar local_1d8;
  secp256k1_scalar local_1b8;
  secp256k1_scalar local_198;
  secp256k1_scalar local_178;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  ulong local_148;
  int local_128;
  int local_124;
  secp256k1_scalar local_120;
  int local_fc;
  secp256k1_scalar local_f8;
  int local_d4;
  secp256k1_scalar local_d0;
  secp256k1_scalar local_b0;
  int local_8c;
  secp256k1_scalar local_40;
  secp256k1_scalar local_20;
  
  random_scalar_order_test(in_stack_fffffffffffffc60);
  random_scalar_order_test(in_stack_fffffffffffffc60);
  random_scalar_order_test(in_stack_fffffffffffffc60);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  secp256k1_scalar_set_int(&local_b0,0);
  for (local_8c = 0; local_8c < 0x100; local_8c = local_8c + 4) {
    uVar1 = secp256k1_scalar_get_bits
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                       in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
    secp256k1_scalar_set_int(&local_d0,uVar1);
    for (local_d4 = 0; local_d4 < 4; local_d4 = local_d4 + 1) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  }
  iVar2 = secp256k1_scalar_eq(&local_b0,&local_20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x8a6,"test condition failed: secp256k1_scalar_eq(&n, &s)");
    abort();
  }
  local_fc = 0;
  secp256k1_scalar_set_int(&local_f8,0);
  for (; local_fc < 0x100; local_fc = local_128 + local_fc) {
    uVar3 = secp256k1_testrand_int(in_stack_fffffffffffffc44);
    local_128 = uVar3 + 1;
    if (0x100 < local_128 + local_fc) {
      local_128 = 0x100 - local_fc;
    }
    uVar1 = secp256k1_scalar_get_bits_var
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),0,0x13d952);
    secp256k1_scalar_set_int(&local_120,uVar1);
    for (local_124 = 0; local_124 < local_128; local_124 = local_124 + 1) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  }
  iVar2 = secp256k1_scalar_eq(&local_f8,&local_20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x8bc,"test condition failed: secp256k1_scalar_eq(&n, &s)");
    abort();
  }
  random_scalar_order_test(in_stack_fffffffffffffc60);
  for (local_14c = 0; local_14c < 100; local_14c = local_14c + 1) {
    uVar3 = secp256k1_testrand_int(in_stack_fffffffffffffc44);
    local_154 = uVar3 + 1;
    local_158 = (int)(local_148 % (ulong)(1L << ((byte)local_154 & 0x3f)));
    local_150 = secp256k1_scalar_shr_int(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    if (local_158 != local_150) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x8c9,"test condition failed: expected == low");
      abort();
    }
  }
  secp256k1_scalar_add
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  secp256k1_scalar_add
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  iVar2 = secp256k1_scalar_eq(&local_178,&local_198);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x8d2,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
    abort();
  }
  uVar4 = secp256k1_testrand_bits(in_stack_fffffffffffffc3c);
  local_200 = (int)uVar4;
  secp256k1_scalar_set_int(&local_1f8,1);
  iVar2 = secp256k1_scalar_is_one(&local_1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x8dc,"test condition failed: secp256k1_scalar_is_one(&b)");
    abort();
  }
  for (local_1fc = 0; local_1fc < local_200; local_1fc = local_1fc + 1) {
    secp256k1_scalar_add
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  }
  local_1b8.d[0] = local_40.d[0];
  local_1b8.d[1] = local_40.d[1];
  local_1b8.d[2] = local_40.d[2];
  local_1b8.d[3] = local_40.d[3];
  local_1d8.d[0] = local_40.d[0];
  local_1d8.d[1] = local_40.d[1];
  local_1d8.d[2] = local_40.d[2];
  local_1d8.d[3] = local_40.d[3];
  iVar2 = secp256k1_scalar_add
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  if (iVar2 == 0) {
    secp256k1_scalar_cadd_bit
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
    iVar2 = secp256k1_scalar_eq(&local_1b8,&local_1d8);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x8e5,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_cadd_bit
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
    iVar2 = secp256k1_scalar_eq(&local_1b8,&local_1d8);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x8e8,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
  }
  secp256k1_scalar_mul
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  secp256k1_scalar_mul
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  iVar2 = secp256k1_scalar_eq(&local_220,&local_240);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x8f1,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
    abort();
  }
  secp256k1_scalar_add
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  secp256k1_scalar_add
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  secp256k1_scalar_add
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  secp256k1_scalar_add
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  iVar2 = secp256k1_scalar_eq(&local_260,&local_280);
  if (iVar2 != 0) {
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    iVar2 = secp256k1_scalar_eq(&local_2a0,&local_2c0);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x905,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_add
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    iVar2 = secp256k1_scalar_eq(&local_2e0,&local_300);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x910,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_sqr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    iVar2 = secp256k1_scalar_eq(local_340,&local_360);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x918,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
      abort();
    }
    secp256k1_scalar_mul
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    iVar2 = secp256k1_scalar_eq((secp256k1_scalar *)&stack0xfffffffffffffc80,&local_40);
    if (iVar2 != 0) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      iVar2 = secp256k1_scalar_eq((secp256k1_scalar *)&stack0xfffffffffffffc60,&local_40);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x926,"test condition failed: secp256k1_scalar_eq(&r1, &s1)");
        abort();
      }
      secp256k1_scalar_mul
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      iVar2 = secp256k1_scalar_eq((secp256k1_scalar *)&stack0xfffffffffffffc40,
                                  &secp256k1_scalar_zero);
      if (iVar2 != 0) {
        return;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x92d,"test condition failed: secp256k1_scalar_eq(&r1, &secp256k1_scalar_zero)");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x91f,"test condition failed: secp256k1_scalar_eq(&r1, &s1)");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x8fb,"test condition failed: secp256k1_scalar_eq(&r1, &r2)");
  abort();
}

Assistant:

static void scalar_test(void) {
    secp256k1_scalar s;
    secp256k1_scalar s1;
    secp256k1_scalar s2;
    unsigned char c[32];

    /* Set 's' to a random scalar, with value 'snum'. */
    random_scalar_order_test(&s);

    /* Set 's1' to a random scalar, with value 's1num'. */
    random_scalar_order_test(&s1);

    /* Set 's2' to a random scalar, with value 'snum2', and byte array representation 'c'. */
    random_scalar_order_test(&s2);
    secp256k1_scalar_get_b32(c, &s2);

    {
        int i;
        /* Test that fetching groups of 4 bits from a scalar and recursing n(i)=16*n(i-1)+p(i) reconstructs it. */
        secp256k1_scalar n;
        secp256k1_scalar_set_int(&n, 0);
        for (i = 0; i < 256; i += 4) {
            secp256k1_scalar t;
            int j;
            secp256k1_scalar_set_int(&t, secp256k1_scalar_get_bits(&s, 256 - 4 - i, 4));
            for (j = 0; j < 4; j++) {
                secp256k1_scalar_add(&n, &n, &n);
            }
            secp256k1_scalar_add(&n, &n, &t);
        }
        CHECK(secp256k1_scalar_eq(&n, &s));
    }

    {
        /* Test that fetching groups of randomly-sized bits from a scalar and recursing n(i)=b*n(i-1)+p(i) reconstructs it. */
        secp256k1_scalar n;
        int i = 0;
        secp256k1_scalar_set_int(&n, 0);
        while (i < 256) {
            secp256k1_scalar t;
            int j;
            int now = secp256k1_testrand_int(15) + 1;
            if (now + i > 256) {
                now = 256 - i;
            }
            secp256k1_scalar_set_int(&t, secp256k1_scalar_get_bits_var(&s, 256 - now - i, now));
            for (j = 0; j < now; j++) {
                secp256k1_scalar_add(&n, &n, &n);
            }
            secp256k1_scalar_add(&n, &n, &t);
            i += now;
        }
        CHECK(secp256k1_scalar_eq(&n, &s));
    }

    {
        /* test secp256k1_scalar_shr_int */
        secp256k1_scalar r;
        int i;
        random_scalar_order_test(&r);
        for (i = 0; i < 100; ++i) {
            int low;
            int shift = 1 + secp256k1_testrand_int(15);
            int expected = r.d[0] % (1ULL << shift);
            low = secp256k1_scalar_shr_int(&r, shift);
            CHECK(expected == low);
        }
    }

    {
        /* Test commutativity of add. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_add(&r1, &s1, &s2);
        secp256k1_scalar_add(&r2, &s2, &s1);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        secp256k1_scalar r1, r2;
        secp256k1_scalar b;
        int i;
        /* Test add_bit. */
        int bit = secp256k1_testrand_bits(8);
        secp256k1_scalar_set_int(&b, 1);
        CHECK(secp256k1_scalar_is_one(&b));
        for (i = 0; i < bit; i++) {
            secp256k1_scalar_add(&b, &b, &b);
        }
        r1 = s1;
        r2 = s1;
        if (!secp256k1_scalar_add(&r1, &r1, &b)) {
            /* No overflow happened. */
            secp256k1_scalar_cadd_bit(&r2, bit, 1);
            CHECK(secp256k1_scalar_eq(&r1, &r2));
            /* cadd is a noop when flag is zero */
            secp256k1_scalar_cadd_bit(&r2, bit, 0);
            CHECK(secp256k1_scalar_eq(&r1, &r2));
        }
    }

    {
        /* Test commutativity of mul. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_mul(&r1, &s1, &s2);
        secp256k1_scalar_mul(&r2, &s2, &s1);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test associativity of add. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_add(&r1, &s1, &s2);
        secp256k1_scalar_add(&r1, &r1, &s);
        secp256k1_scalar_add(&r2, &s2, &s);
        secp256k1_scalar_add(&r2, &s1, &r2);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test associativity of mul. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_mul(&r1, &s1, &s2);
        secp256k1_scalar_mul(&r1, &r1, &s);
        secp256k1_scalar_mul(&r2, &s2, &s);
        secp256k1_scalar_mul(&r2, &s1, &r2);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test distributitivity of mul over add. */
        secp256k1_scalar r1, r2, t;
        secp256k1_scalar_add(&r1, &s1, &s2);
        secp256k1_scalar_mul(&r1, &r1, &s);
        secp256k1_scalar_mul(&r2, &s1, &s);
        secp256k1_scalar_mul(&t, &s2, &s);
        secp256k1_scalar_add(&r2, &r2, &t);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test square. */
        secp256k1_scalar r1, r2;
        secp256k1_scalar_sqr(&r1, &s1);
        secp256k1_scalar_mul(&r2, &s1, &s1);
        CHECK(secp256k1_scalar_eq(&r1, &r2));
    }

    {
        /* Test multiplicative identity. */
        secp256k1_scalar r1;
        secp256k1_scalar_mul(&r1, &s1, &secp256k1_scalar_one);
        CHECK(secp256k1_scalar_eq(&r1, &s1));
    }

    {
        /* Test additive identity. */
        secp256k1_scalar r1;
        secp256k1_scalar_add(&r1, &s1, &secp256k1_scalar_zero);
        CHECK(secp256k1_scalar_eq(&r1, &s1));
    }

    {
        /* Test zero product property. */
        secp256k1_scalar r1;
        secp256k1_scalar_mul(&r1, &s1, &secp256k1_scalar_zero);
        CHECK(secp256k1_scalar_eq(&r1, &secp256k1_scalar_zero));
    }

}